

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O3

Point2f pbrt::InvertSphericalRectangleSample
                  (Point3f *pRef,Point3f *s,Vector3f *ex,Vector3f *ey,Point3f *pRect)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 uVar3;
  bool bVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  ulong uVar7;
  int iVar8;
  long in_FS_OFFSET;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar21;
  float fVar22;
  float fVar23;
  Tuple2<pbrt::Point2,_float> TVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [64];
  undefined1 auVar28 [16];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar49;
  float fVar51;
  undefined1 auVar44 [16];
  float fVar50;
  float fVar52;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar74;
  float fVar76;
  undefined1 auVar75 [16];
  float fVar77;
  float local_170;
  undefined1 local_168 [8];
  float fStack_160;
  float fStack_15c;
  float local_158;
  float local_148;
  float local_138;
  uint local_128;
  float local_108;
  undefined1 local_e8 [8];
  float fStack_e0;
  float fStack_dc;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  undefined1 extraout_var_04 [60];
  undefined1 extraout_var_05 [60];
  undefined1 extraout_var_06 [60];
  
  fVar21 = (s->super_Tuple3<pbrt::Point3,_float>).x - (pRef->super_Tuple3<pbrt::Point3,_float>).x;
  auVar28 = vinsertps_avx(ZEXT416((uint)(ey->super_Tuple3<pbrt::Vector3,_float>).y),
                          ZEXT416((uint)(ex->super_Tuple3<pbrt::Vector3,_float>).y),0x10);
  auVar19 = vinsertps_avx(ZEXT416((uint)(ey->super_Tuple3<pbrt::Vector3,_float>).z),
                          ZEXT416((uint)(ex->super_Tuple3<pbrt::Vector3,_float>).z),0x10);
  fVar74 = (s->super_Tuple3<pbrt::Point3,_float>).y - (pRef->super_Tuple3<pbrt::Point3,_float>).y;
  fVar23 = (s->super_Tuple3<pbrt::Point3,_float>).z - (pRef->super_Tuple3<pbrt::Point3,_float>).z;
  auVar15 = vinsertps_avx(ZEXT416((uint)(ey->super_Tuple3<pbrt::Vector3,_float>).x),
                          ZEXT416((uint)(ex->super_Tuple3<pbrt::Vector3,_float>).x),0x10);
  auVar17._0_4_ =
       auVar15._0_4_ * auVar15._0_4_ + auVar28._0_4_ * auVar28._0_4_ + auVar19._0_4_ * auVar19._0_4_
  ;
  auVar17._4_4_ =
       auVar15._4_4_ * auVar15._4_4_ + auVar28._4_4_ * auVar28._4_4_ + auVar19._4_4_ * auVar19._4_4_
  ;
  auVar17._8_4_ =
       auVar15._8_4_ * auVar15._8_4_ + auVar28._8_4_ * auVar28._8_4_ + auVar19._8_4_ * auVar19._8_4_
  ;
  auVar17._12_4_ =
       auVar15._12_4_ * auVar15._12_4_ + auVar28._12_4_ * auVar28._12_4_ +
       auVar19._12_4_ * auVar19._12_4_;
  auVar2 = vsqrtps_avx(auVar17);
  auVar17 = vdivps_avx(auVar19,auVar2);
  auVar28 = vdivps_avx(auVar28,auVar2);
  auVar64 = vdivps_avx(auVar15,auVar2);
  auVar16 = vmovshdup_avx(auVar17);
  auVar1 = vmovshdup_avx(auVar28);
  auVar46 = vmovshdup_avx(auVar64);
  fVar43 = auVar28._0_4_;
  auVar15 = ZEXT416((uint)(fVar43 * auVar16._0_4_));
  auVar19 = vfmsub213ss_fma(auVar17,auVar1,auVar15);
  auVar66 = vfnmadd231ss_fma(auVar15,auVar16,auVar28);
  auVar18 = ZEXT416((uint)(auVar46._0_4_ * auVar17._0_4_));
  auVar15 = vfmsub213ss_fma(auVar64,auVar16,auVar18);
  auVar11 = vfnmadd231ss_fma(auVar18,auVar46,auVar17);
  auVar9 = ZEXT416((uint)(auVar1._0_4_ * auVar64._0_4_));
  auVar18 = vfmsub213ss_fma(auVar28,auVar46,auVar9);
  auVar9 = vfnmadd231ss_fma(auVar9,auVar1,auVar64);
  auVar25._0_4_ = fVar43 * fVar74;
  auVar25._4_4_ = auVar28._4_4_ * fVar74;
  auVar25._8_4_ = auVar28._8_4_ * fVar74;
  auVar25._12_4_ = auVar28._12_4_ * fVar74;
  auVar13._4_4_ = fVar21;
  auVar13._0_4_ = fVar21;
  auVar13._8_4_ = fVar21;
  auVar13._12_4_ = fVar21;
  auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar74 * (auVar15._0_4_ + auVar11._0_4_))),
                            ZEXT416((uint)fVar21),ZEXT416((uint)(auVar19._0_4_ + auVar66._0_4_)));
  auVar28 = vfmadd213ps_fma(auVar13,auVar64,auVar25);
  auVar70._8_4_ = 0x80000000;
  auVar70._0_8_ = 0x8000000080000000;
  auVar70._12_4_ = 0x80000000;
  auVar15._4_4_ = fVar23;
  auVar15._0_4_ = fVar23;
  auVar15._8_4_ = fVar23;
  auVar15._12_4_ = fVar23;
  auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)fVar23),
                            ZEXT416((uint)(auVar18._0_4_ + auVar9._0_4_)));
  auVar25 = vfmadd213ps_fma(auVar15,auVar17,auVar28);
  auVar28._0_8_ = auVar19._0_8_ ^ 0x8000000080000000;
  auVar28._8_4_ = auVar19._8_4_ ^ 0x80000000;
  auVar28._12_4_ = auVar19._12_4_ ^ 0x80000000;
  auVar15 = vminss_avx(auVar28,auVar19);
  auVar11._0_4_ = auVar2._0_4_ + auVar25._0_4_;
  auVar11._4_4_ = auVar2._4_4_ + auVar25._4_4_;
  auVar11._8_4_ = auVar2._8_4_ + auVar25._8_4_;
  auVar11._12_4_ = auVar2._12_4_ + auVar25._12_4_;
  fVar65 = auVar15._0_4_;
  auVar53._4_4_ = fVar65;
  auVar53._0_4_ = fVar65;
  auVar53._8_4_ = fVar65;
  auVar53._12_4_ = fVar65;
  auVar2 = vinsertps_avx(auVar25,auVar11,0x10);
  auVar28 = vinsertps_avx(auVar11,auVar25,0x4c);
  auVar19 = vshufps_avx(auVar11,auVar11,0xe1);
  fVar74 = auVar2._0_4_;
  auVar66._0_4_ = fVar74 * fVar65;
  fVar23 = auVar2._4_4_;
  auVar66._4_4_ = fVar23 * fVar65;
  fVar76 = auVar2._8_4_;
  auVar66._8_4_ = fVar76 * fVar65;
  fVar62 = auVar2._12_4_;
  auVar66._12_4_ = fVar62 * fVar65;
  auVar12._0_4_ = auVar28._0_4_ * fVar65;
  auVar12._4_4_ = auVar28._4_4_ * fVar65;
  auVar12._8_4_ = auVar28._8_4_ * fVar65;
  auVar12._12_4_ = auVar28._12_4_ * fVar65;
  auVar10._0_4_ = auVar19._0_4_ * auVar25._0_4_;
  auVar10._4_4_ = auVar19._4_4_ * auVar25._4_4_;
  auVar10._8_4_ = auVar19._8_4_ * auVar25._8_4_;
  auVar10._12_4_ = auVar19._12_4_ * auVar25._12_4_;
  auVar18 = vinsertps_avx(auVar19,auVar25,0x1c);
  uVar7 = CONCAT44(auVar66._4_4_,auVar66._0_4_);
  auVar63._0_8_ = uVar7 ^ 0x8000000080000000;
  auVar63._8_4_ = -auVar66._8_4_;
  auVar63._12_4_ = -auVar66._12_4_;
  auVar13 = vfnmadd213ps_fma(auVar2,auVar53,auVar66);
  auVar66 = vfmsub231ps_fma(auVar66,auVar2,auVar53);
  auVar14 = vfnmadd213ps_fma(auVar53,auVar28,auVar12);
  auVar9 = vxorps_avx512vl(auVar12,auVar70);
  auVar19 = vfmsub213ps_fma(auVar28,auVar2,auVar10);
  auVar71._0_4_ = auVar66._0_4_ + auVar13._0_4_;
  auVar71._4_4_ = auVar66._4_4_ + auVar13._4_4_;
  auVar71._8_4_ = auVar66._8_4_ + auVar13._8_4_;
  auVar71._12_4_ = auVar66._12_4_ + auVar13._12_4_;
  auVar28 = vinsertps_avx(auVar25,auVar11,0x4c);
  auVar66 = vfmsub231ps_fma(auVar12,auVar53,auVar28);
  auVar70 = vfnmadd213ps_fma(auVar28,auVar2,auVar10);
  auVar72._0_4_ = auVar66._0_4_ + auVar14._0_4_;
  auVar72._4_4_ = auVar66._4_4_ + auVar14._4_4_;
  auVar72._8_4_ = auVar66._8_4_ + auVar14._8_4_;
  auVar72._12_4_ = auVar66._12_4_ + auVar14._12_4_;
  uVar7 = CONCAT44(auVar10._4_4_,auVar10._0_4_);
  auVar68._0_8_ = uVar7 ^ 0x8000000080000000;
  auVar68._8_4_ = -auVar10._8_4_;
  auVar68._12_4_ = -auVar10._12_4_;
  auVar10 = vaddps_avx512vl(auVar19,auVar70);
  auVar66 = vmovshdup_avx(auVar11);
  auVar28 = vblendps_avx(auVar11,auVar53,2);
  auVar19 = vblendps_avx(auVar11,auVar25,2);
  auVar11 = vmulps_avx512vl(auVar10,auVar10);
  auVar73._0_4_ = auVar11._0_4_ + auVar71._0_4_ * auVar71._0_4_ + auVar72._0_4_ * auVar72._0_4_;
  auVar73._4_4_ = auVar11._4_4_ + auVar71._4_4_ * auVar71._4_4_ + auVar72._4_4_ * auVar72._4_4_;
  auVar73._8_4_ = auVar11._8_4_ + auVar71._8_4_ * auVar71._8_4_ + auVar72._8_4_ * auVar72._8_4_;
  auVar73._12_4_ =
       auVar11._12_4_ + auVar71._12_4_ * auVar71._12_4_ + auVar72._12_4_ * auVar72._12_4_;
  auVar11 = vshufps_avx512vl(auVar9,auVar9,0xf5);
  auVar12 = vfmadd231ss_fma(auVar11,auVar15,auVar66);
  auVar15 = vblendps_avx(auVar68,auVar63,2);
  auVar11 = vmovshdup_avx(auVar14);
  auVar9 = vinsertps_avx512f(auVar63,auVar9,0x1c);
  auVar15 = vfmadd231ps_fma(auVar15,auVar18,auVar28);
  auVar28 = vblendps_avx(auVar70,auVar13,2);
  auVar18 = vfmadd231ps_fma(auVar9,auVar53,auVar19);
  auVar19 = vinsertps_avx(auVar13,auVar14,0x1c);
  auVar9 = vsqrtps_avx(auVar73);
  fVar21 = auVar12._0_4_ + auVar11._0_4_;
  auVar14._0_4_ = auVar15._0_4_ + auVar28._0_4_;
  auVar14._4_4_ = auVar15._4_4_ + auVar28._4_4_;
  auVar14._8_4_ = auVar15._8_4_ + auVar28._8_4_;
  auVar14._12_4_ = auVar15._12_4_ + auVar28._12_4_;
  local_168._0_4_ = auVar18._0_4_ + auVar19._0_4_;
  local_168._4_4_ = auVar18._4_4_ + auVar19._4_4_;
  fStack_160 = auVar18._8_4_ + auVar19._8_4_;
  fStack_15c = auVar18._12_4_ + auVar19._12_4_;
  auVar11 = vshufps_avx(auVar68,auVar68,0xf5);
  auVar18._0_4_ = auVar14._0_4_ * auVar14._0_4_;
  auVar18._4_4_ = auVar14._4_4_ * auVar14._4_4_;
  auVar18._8_4_ = auVar14._8_4_ * auVar14._8_4_;
  auVar18._12_4_ = auVar14._12_4_ * auVar14._12_4_;
  auVar19._0_4_ = (float)local_168._0_4_ * (float)local_168._0_4_;
  auVar19._4_4_ = (float)local_168._4_4_ * (float)local_168._4_4_;
  auVar19._8_4_ = fStack_160 * fStack_160;
  auVar19._12_4_ = fStack_15c * fStack_15c;
  auVar28 = vmovshdup_avx(auVar18);
  auVar15 = vhaddps_avx(auVar19,auVar19);
  auVar12 = vdivss_avx512f(auVar72,auVar9);
  auVar13 = vdivps_avx512vl(auVar71,auVar9);
  auVar28 = ZEXT416((uint)(auVar18._0_4_ + auVar28._0_4_ + fVar21 * fVar21));
  auVar28 = vsqrtss_avx(auVar28,auVar28);
  fVar77 = auVar12._0_4_;
  auVar69._0_4_ = auVar28._0_4_;
  auVar75._0_4_ = fVar21 / auVar69._0_4_;
  auVar75._4_12_ = SUB6012((undefined1  [60])0x0,0);
  auVar69._4_4_ = auVar69._0_4_;
  auVar69._8_4_ = auVar69._0_4_;
  auVar69._12_4_ = auVar69._0_4_;
  auVar28 = vdivps_avx(auVar14,auVar69);
  auVar19 = vinsertps_avx(auVar72,auVar71,0x4c);
  auVar18 = vmovshdup_avx(auVar9);
  auVar19 = vdivps_avx(auVar19,auVar18);
  auVar18 = vmovshdup_avx(auVar25);
  auVar25 = vfmadd231ss_fma(auVar11,auVar18,auVar25);
  auVar11 = vmovshdup_avx(auVar70);
  fVar21 = auVar25._0_4_ + auVar11._0_4_;
  auVar11 = vmovshdup_avx(auVar28);
  auVar14 = vdivps_avx512vl(auVar10,auVar9);
  auVar15 = ZEXT416((uint)(fVar21 * fVar21 + auVar15._0_4_));
  auVar15 = vsqrtss_avx(auVar15,auVar15);
  local_e8._4_4_ = auVar15._0_4_;
  local_e8._0_4_ = local_e8._4_4_;
  fStack_e0 = (float)local_e8._4_4_;
  fStack_dc = (float)local_e8._4_4_;
  auVar15 = vmulss_avx512f(auVar75,auVar12);
  auVar15 = vfnmsub231ss_avx512f(auVar15,auVar13,auVar11);
  auVar9 = vfnmadd231ss_fma(auVar15,auVar14,auVar28);
  auVar15 = vinsertps_avx512f(auVar14,auVar13,0x1c);
  auVar25 = auVar28;
  if (0.0 <= auVar9._0_4_) {
    fVar22 = auVar28._0_4_ + auVar15._0_4_;
    fVar41 = auVar28._4_4_ + auVar15._4_4_;
    fVar49 = auVar28._8_4_ + auVar15._8_4_;
    fVar42 = auVar28._12_4_ + auVar15._12_4_;
    auVar9 = vaddss_avx512f(auVar75,auVar12);
    auVar27._0_4_ = fVar22 * fVar22;
    auVar27._4_4_ = fVar41 * fVar41;
    auVar27._8_4_ = fVar49 * fVar49;
    auVar27._12_4_ = fVar42 * fVar42;
    auVar15 = vmovshdup_avx(auVar27);
    auVar15 = ZEXT416((uint)(auVar27._0_4_ + auVar15._0_4_ + auVar9._0_4_ * auVar9._0_4_));
    auVar15 = vsqrtss_avx(auVar15,auVar15);
    auVar9 = ZEXT416((uint)(auVar15._0_4_ * 0.5));
    auVar15 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar9);
    uVar3 = vcmpss_avx512f(auVar9,SUB6416(ZEXT464(0xbf800000),0),1);
    bVar4 = (bool)((byte)uVar3 & 1);
    local_170 = asinf((float)((uint)bVar4 * -0x40800000 + (uint)!bVar4 * auVar15._0_4_));
    local_170 = local_170 + local_170;
  }
  else {
    auVar15 = vsubps_avx(auVar28,auVar15);
    auVar9 = vsubss_avx512f(auVar75,auVar12);
    auVar26._0_4_ = auVar15._0_4_ * auVar15._0_4_;
    auVar26._4_4_ = auVar15._4_4_ * auVar15._4_4_;
    auVar26._8_4_ = auVar15._8_4_ * auVar15._8_4_;
    auVar26._12_4_ = auVar15._12_4_ * auVar15._12_4_;
    auVar15 = vmovshdup_avx(auVar26);
    auVar15 = ZEXT416((uint)(auVar26._0_4_ + auVar15._0_4_ + auVar9._0_4_ * auVar9._0_4_));
    auVar15 = vsqrtss_avx(auVar15,auVar15);
    auVar9 = ZEXT416((uint)(auVar15._0_4_ * 0.5));
    auVar15 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar9);
    uVar3 = vcmpss_avx512f(auVar9,SUB6416(ZEXT464(0xbf800000),0),1);
    bVar4 = (bool)((byte)uVar3 & 1);
    auVar33._0_4_ = asinf((float)((uint)bVar4 * -0x40800000 + (uint)!bVar4 * auVar15._0_4_));
    auVar33._4_60_ = extraout_var;
    auVar15 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar33._0_16_,ZEXT416(0x40490fdb));
    local_170 = auVar15._0_4_;
  }
  auVar15 = vdivps_avx(_local_168,_local_e8);
  auVar9 = vmovshdup_avx(auVar19);
  auVar12 = vmovshdup_avx(auVar14);
  fVar22 = auVar9._0_4_;
  local_128 = auVar11._0_4_;
  auVar11 = vfnmsub231ss_fma(ZEXT416((uint)(fVar22 * auVar75._0_4_)),auVar19,ZEXT416(local_128));
  fVar21 = fVar21 / (float)local_e8._4_4_;
  auVar11 = vfnmadd231ss_fma(auVar11,auVar12,auVar28);
  if (0.0 <= auVar11._0_4_) {
    auVar11 = vpermi2ps_avx512vl(_DAT_003c76d0,auVar19,auVar14);
    fVar41 = auVar11._0_4_ + auVar28._0_4_;
    fVar49 = auVar11._4_4_ + auVar28._4_4_;
    fVar42 = auVar11._8_4_ + auVar28._8_4_;
    fVar50 = auVar11._12_4_ + auVar28._12_4_;
    auVar9._0_4_ = fVar41 * fVar41;
    auVar9._4_4_ = fVar49 * fVar49;
    auVar9._8_4_ = fVar42 * fVar42;
    auVar9._12_4_ = fVar50 * fVar50;
    auVar28 = vmovshdup_avx(auVar9);
    auVar28 = ZEXT416((uint)(auVar9._0_4_ +
                            auVar28._0_4_ + (fVar22 + auVar75._0_4_) * (fVar22 + auVar75._0_4_)));
    auVar28 = vsqrtss_avx(auVar28,auVar28);
    auVar11 = ZEXT416((uint)(auVar28._0_4_ * 0.5));
    auVar28 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar11);
    uVar3 = vcmpss_avx512f(auVar11,SUB6416(ZEXT464(0xbf800000),0),1);
    bVar4 = (bool)((byte)uVar3 & 1);
    local_138 = asinf((float)((uint)bVar4 * -0x40800000 + (uint)!bVar4 * auVar28._0_4_));
    local_138 = local_138 + local_138;
  }
  else {
    auVar11 = vpermi2ps_avx512vl(_DAT_003c76d0,auVar19,auVar14);
    auVar28 = vsubps_avx(auVar11,auVar28);
    auVar44._0_4_ = auVar28._0_4_ * auVar28._0_4_;
    auVar44._4_4_ = auVar28._4_4_ * auVar28._4_4_;
    auVar44._8_4_ = auVar28._8_4_ * auVar28._8_4_;
    auVar44._12_4_ = auVar28._12_4_ * auVar28._12_4_;
    auVar28 = vmovshdup_avx(auVar44);
    auVar28 = ZEXT416((uint)(auVar44._0_4_ +
                            auVar28._0_4_ + (fVar22 - auVar75._0_4_) * (fVar22 - auVar75._0_4_)));
    auVar28 = vsqrtss_avx(auVar28,auVar28);
    auVar11 = ZEXT416((uint)(auVar28._0_4_ * 0.5));
    auVar28 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar11);
    uVar3 = vcmpss_avx512f(auVar11,SUB6416(ZEXT464(0xbf800000),0),1);
    bVar4 = (bool)((byte)uVar3 & 1);
    auVar34._0_4_ = asinf((float)((uint)bVar4 * -0x40800000 + (uint)!bVar4 * auVar28._0_4_));
    auVar34._4_60_ = extraout_var_00;
    auVar28 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar34._0_16_,ZEXT416(0x40490fdb));
    local_138 = auVar28._0_4_;
  }
  auVar28 = vmovshdup_avx(auVar15);
  fVar41 = auVar28._0_4_;
  auVar28 = vfnmsub231ss_fma(ZEXT416((uint)(fVar41 * fVar22)),auVar15,auVar19);
  auVar28 = vfnmadd231ss_fma(auVar28,auVar12,ZEXT416((uint)fVar21));
  fVar49 = auVar12._0_4_;
  fVar22 = auVar15._0_4_;
  if (0.0 <= auVar28._0_4_) {
    fVar42 = fVar22 + auVar19._0_4_;
    fVar50 = auVar15._4_4_ + auVar19._4_4_;
    fVar51 = auVar15._8_4_ + auVar19._8_4_;
    fVar52 = auVar15._12_4_ + auVar19._12_4_;
    auVar45._0_4_ = fVar42 * fVar42;
    auVar45._4_4_ = fVar50 * fVar50;
    auVar45._8_4_ = fVar51 * fVar51;
    auVar45._12_4_ = fVar52 * fVar52;
    auVar28 = vhaddps_avx(auVar45,auVar45);
    auVar28 = ZEXT416((uint)((fVar21 + fVar49) * (fVar21 + fVar49) + auVar28._0_4_));
    auVar28 = vsqrtss_avx(auVar28,auVar28);
    auVar19 = ZEXT416((uint)(auVar28._0_4_ * 0.5));
    auVar28 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar19);
    uVar3 = vcmpss_avx512f(auVar19,SUB6416(ZEXT464(0xbf800000),0),1);
    bVar4 = (bool)((byte)uVar3 & 1);
    local_158 = asinf((float)((uint)bVar4 * -0x40800000 + (uint)!bVar4 * auVar28._0_4_));
    local_158 = local_158 + local_158;
  }
  else {
    auVar28 = vsubps_avx(auVar15,auVar19);
    auVar29._0_4_ = auVar28._0_4_ * auVar28._0_4_;
    auVar29._4_4_ = auVar28._4_4_ * auVar28._4_4_;
    auVar29._8_4_ = auVar28._8_4_ * auVar28._8_4_;
    auVar29._12_4_ = auVar28._12_4_ * auVar28._12_4_;
    auVar28 = vhaddps_avx(auVar29,auVar29);
    auVar28 = ZEXT416((uint)((fVar21 - fVar49) * (fVar21 - fVar49) + auVar28._0_4_));
    auVar28 = vsqrtss_avx(auVar28,auVar28);
    auVar19 = ZEXT416((uint)(auVar28._0_4_ * 0.5));
    auVar28 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar19);
    uVar3 = vcmpss_avx512f(auVar19,SUB6416(ZEXT464(0xbf800000),0),1);
    bVar4 = (bool)((byte)uVar3 & 1);
    auVar35._0_4_ = asinf((float)((uint)bVar4 * -0x40800000 + (uint)!bVar4 * auVar28._0_4_));
    auVar35._4_60_ = extraout_var_01;
    auVar28 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar35._0_16_,ZEXT416(0x40490fdb));
    local_158 = auVar28._0_4_;
  }
  auVar28 = vfnmsub231ss_fma(ZEXT416((uint)(fVar77 * fVar41)),auVar15,auVar13);
  auVar28 = vfnmadd231ss_fma(auVar28,ZEXT416((uint)fVar21),auVar14);
  fVar42 = auVar14._0_4_;
  if (0.0 <= auVar28._0_4_) {
    fVar22 = auVar13._0_4_ + fVar22;
    auVar28 = ZEXT416((uint)((fVar42 + fVar21) * (fVar42 + fVar21) +
                            fVar22 * fVar22 + (fVar77 + fVar41) * (fVar77 + fVar41)));
    auVar28 = vsqrtss_avx(auVar28,auVar28);
    auVar19 = ZEXT416((uint)(auVar28._0_4_ * 0.5));
    auVar28 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar19);
    uVar3 = vcmpss_avx512f(auVar19,SUB6416(ZEXT464(0xbf800000),0),1);
    bVar4 = (bool)((byte)uVar3 & 1);
    fVar21 = asinf((float)((uint)bVar4 * -0x40800000 + (uint)!bVar4 * auVar28._0_4_));
    fVar21 = fVar21 + fVar21;
  }
  else {
    fVar22 = auVar13._0_4_ - fVar22;
    auVar28 = ZEXT416((uint)((fVar42 - fVar21) * (fVar42 - fVar21) +
                            fVar22 * fVar22 + (fVar77 - fVar41) * (fVar77 - fVar41)));
    auVar28 = vsqrtss_avx(auVar28,auVar28);
    auVar19 = ZEXT416((uint)(auVar28._0_4_ * 0.5));
    auVar28 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar19);
    uVar3 = vcmpss_avx512f(auVar19,SUB6416(ZEXT464(0xbf800000),0),1);
    bVar4 = (bool)((byte)uVar3 & 1);
    auVar36._0_4_ = asinf((float)((uint)bVar4 * -0x40800000 + (uint)!bVar4 * auVar28._0_4_));
    auVar36._4_60_ = extraout_var_02;
    auVar28 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar36._0_16_,ZEXT416(0x40490fdb));
    fVar21 = auVar28._0_4_;
  }
  fVar77 = local_170 + local_138 + local_158 + fVar21 + -6.2831855;
  if (0.001 <= fVar77) {
    fVar22 = (pRect->super_Tuple3<pbrt::Point3,_float>).y -
             (pRef->super_Tuple3<pbrt::Point3,_float>).y;
    fVar41 = (pRect->super_Tuple3<pbrt::Point3,_float>).x -
             (pRef->super_Tuple3<pbrt::Point3,_float>).x;
    fVar50 = (pRect->super_Tuple3<pbrt::Point3,_float>).z -
             (pRef->super_Tuple3<pbrt::Point3,_float>).z;
    auVar28 = vfmadd231ss_fma(ZEXT416((uint)(fVar22 * auVar1._0_4_)),ZEXT416((uint)fVar41),
                              ZEXT416((uint)auVar46._0_4_));
    auVar19 = vfmadd231ss_fma(auVar28,ZEXT416((uint)fVar50),ZEXT416((uint)auVar16._0_4_));
    auVar28 = vminss_avx(auVar66,auVar19);
    uVar3 = vcmpss_avx512f(auVar19,auVar18,1);
    bVar4 = (bool)((byte)uVar3 & 1);
    auVar16._4_12_ = auVar28._4_12_;
    auVar16._0_4_ = (uint)bVar4 * auVar18._0_4_ + (uint)!bVar4 * auVar28._0_4_;
    uVar3 = vcmpss_avx512f(auVar16,ZEXT816(0) << 0x20,0);
    bVar4 = (bool)((byte)uVar3 & 1);
    fVar52 = (float)((uint)bVar4 * 0x2edbe6ff + (uint)!bVar4 * auVar16._0_4_);
    fVar51 = ((fVar65 * fVar65) / (fVar52 * fVar52) + 1.0) - fVar42 * fVar42;
    if (fVar51 < 0.0) {
      auVar37._0_4_ = sqrtf(fVar51);
      auVar37._4_60_ = extraout_var_03;
      auVar28 = auVar37._0_16_;
    }
    else {
      auVar28 = vsqrtss_avx(ZEXT416((uint)fVar51),ZEXT416((uint)fVar51));
    }
    if (InvertSphericalRectangleSample(pbrt::Point3<float>const&,pbrt::Point3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Point3<float>const&)
        ::reg == '\0') {
      iVar8 = __cxa_guard_acquire(&InvertSphericalRectangleSample(pbrt::Point3<float>const&,pbrt::Point3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Point3<float>const&)
                                   ::reg);
      if (iVar8 != 0) {
        StatRegisterer::StatRegisterer
                  ((StatRegisterer *)
                   &InvertSphericalRectangleSample(pbrt::Point3<float>const&,pbrt::Point3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Point3<float>const&)
                    ::reg,InvertSphericalRectangleSample(pbrt::Point3<float>const&,pbrt::
                          Point3<float>const&,pbrt::Vector3<float>const&,pbrt::
                          Vector3<float>const&,pbrt::Point3<float>const&)::$_0::__invoke(pbrt::
                          StatsAccumulator__,(PixelAccumFunc)0x0);
        __cxa_guard_release(&InvertSphericalRectangleSample(pbrt::Point3<float>const&,pbrt::Point3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Point3<float>const&)
                             ::reg);
      }
    }
    *(long *)(in_FS_OFFSET + -0x298) = *(long *)(in_FS_OFFSET + -0x298) + 1;
    auVar1._8_4_ = 0x80000000;
    auVar1._0_8_ = 0x8000000080000000;
    auVar1._12_4_ = 0x80000000;
    auVar15 = vxorps_avx512vl(auVar12,auVar1);
    auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar22 * fVar43)),ZEXT416((uint)fVar41),
                              ZEXT416((uint)auVar64._0_4_));
    auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)fVar50),ZEXT416((uint)auVar17._0_4_));
    auVar64._8_4_ = 0x7fffffff;
    auVar64._0_8_ = 0x7fffffff7fffffff;
    auVar64._12_4_ = 0x7fffffff;
    auVar17 = vpternlogd_avx512vl(ZEXT416((uint)fVar52),auVar28,auVar64,0xd8);
    fVar43 = auVar17._0_4_;
    if ((fVar43 == 0.0) && (!NAN(fVar43))) {
      *(long *)(in_FS_OFFSET + -0x2a0) = *(long *)(in_FS_OFFSET + -0x2a0) + 1;
    }
    auVar54._0_4_ = -(fVar49 * fVar49);
    auVar54._4_4_ = 0x80000000;
    auVar54._8_4_ = 0x80000000;
    auVar54._12_4_ = 0x80000000;
    auVar64 = vinsertps_avx(auVar14,auVar15,0x10);
    auVar18 = vinsertps_avx(auVar54,ZEXT416((uint)(fVar49 * fVar49)),0x1c);
    auVar64 = vfmadd231ps_fma(auVar18,auVar14,auVar64);
    local_148 = -fVar43;
    auVar64 = vhaddps_avx(auVar64,auVar64);
    auVar64 = vmaxss_avx(ZEXT416((uint)(auVar64._0_4_ + fVar51)),ZEXT816(0) << 0x40);
    auVar67._8_4_ = 0x7fffffff;
    auVar67._0_8_ = 0x7fffffff7fffffff;
    auVar67._12_4_ = 0x7fffffff;
    auVar64 = vsqrtss_avx(auVar64,auVar64);
    auVar18 = vpternlogd_avx512vl(ZEXT416((uint)(fVar42 * -fVar43)),auVar67,
                                  ZEXT416((uint)(fVar42 * auVar64._0_4_)),0xb8);
    auVar28 = vpand_avx(auVar67,auVar28);
    auVar15 = vfmadd213ss_fma(auVar15,auVar17,auVar18);
    auVar28 = vfmsub231ss_fma(ZEXT416((uint)(auVar28._0_4_ * auVar64._0_4_)),auVar14,auVar12);
    auVar38._0_4_ = atan2f(auVar15._0_4_,auVar28._0_4_);
    auVar38._4_60_ = extraout_var_04;
    uVar3 = vcmpss_avx512f(ZEXT816(0) << 0x40,auVar38._0_16_,1);
    bVar4 = (bool)((byte)uVar3 & 1);
    uVar3 = vcmpss_avx512f(auVar17,ZEXT416((uint)local_148),0);
    bVar5 = (bool)((byte)uVar3 & 1);
    fVar43 = fVar52 * fVar52 + fVar65 * fVar65;
    local_108 = auVar19._0_4_;
    auVar46._0_4_ = fVar43 + fVar74 * fVar74;
    auVar46._4_4_ = fVar43 + fVar23 * fVar23;
    auVar46._8_4_ = fVar43 + fVar76 * fVar76;
    auVar46._12_4_ = fVar43 + fVar62 * fVar62;
    auVar28 = vsqrtps_avx(auVar46);
    auVar28 = vdivps_avx(auVar2,auVar28);
    auVar17 = vmovshdup_avx(auVar28);
    fVar62 = auVar28._0_4_;
    fVar65 = auVar17._0_4_;
    fVar76 = fVar62 - fVar65;
    auVar55._0_4_ = -(fVar62 * fVar65);
    auVar55._4_4_ = 0x80000000;
    auVar55._8_4_ = 0x80000000;
    auVar55._12_4_ = 0x80000000;
    auVar60._0_8_ = auVar28._0_8_ ^ 0x8000000080000000;
    auVar60._8_4_ = auVar28._8_4_ ^ 0x80000000;
    auVar60._12_4_ = auVar28._12_4_ ^ 0x80000000;
    auVar19 = vinsertps_avx(auVar28,auVar60,0x10);
    auVar15 = vinsertps_avx(auVar55,ZEXT416((uint)(fVar62 * fVar65)),0x1c);
    auVar28 = vfmadd231ps_fma(auVar15,auVar28,auVar19);
    fVar74 = local_108 * local_108 + fVar43;
    auVar2._8_4_ = 0x7fffffff;
    auVar2._0_8_ = 0x7fffffff7fffffff;
    auVar2._12_4_ = 0x7fffffff;
    auVar19 = vandps_avx512vl(ZEXT416((uint)fVar76),auVar2);
    auVar28 = vhaddps_avx(auVar28,auVar28);
    fVar23 = local_108 * local_108 * fVar74;
    if (fVar23 < 0.0) {
      fVar22 = sqrtf(fVar23);
    }
    else {
      auVar15 = vsqrtss_avx(ZEXT416((uint)fVar23),ZEXT416((uint)fVar23));
      fVar22 = auVar15._0_4_;
    }
    fVar76 = fVar76 * fVar76;
    if (fVar23 < 0.0) {
      fVar23 = sqrtf(fVar23);
    }
    else {
      auVar15 = vsqrtss_avx(ZEXT416((uint)fVar23),ZEXT416((uint)fVar23));
      fVar23 = auVar15._0_4_;
    }
    auVar15 = vsqrtss_avx(auVar25,ZEXT416((uint)fVar43));
    auVar47._8_4_ = 0x3f800000;
    auVar47._0_8_ = 0x3f8000003f800000;
    auVar47._12_4_ = 0x3f800000;
    auVar56._4_4_ = fVar76;
    auVar56._0_4_ = fVar76;
    auVar56._8_4_ = fVar76;
    auVar56._12_4_ = fVar76;
    auVar28 = vinsertps_avx(ZEXT416((uint)(auVar28._0_4_ - (auVar19._0_4_ * fVar22) / fVar74)),
                            ZEXT416((uint)(auVar28._0_4_ + (auVar19._0_4_ * fVar23) / fVar74)),0x10)
    ;
    auVar28 = vdivps_avx(auVar28,auVar56);
    local_168._4_4_ = auVar17._4_4_;
    fStack_160 = auVar17._8_4_;
    fStack_15c = auVar17._12_4_;
    auVar61._0_4_ = auVar28._0_4_ * fVar65;
    auVar61._4_4_ = auVar28._4_4_ * (float)local_168._4_4_;
    auVar61._8_4_ = auVar28._8_4_ * fStack_160;
    auVar61._12_4_ = auVar28._12_4_ * fStack_15c;
    auVar19 = vsubps_avx(auVar47,auVar28);
    auVar57._4_4_ = fVar62;
    auVar57._0_4_ = fVar62;
    auVar57._8_4_ = fVar62;
    auVar57._12_4_ = fVar62;
    auVar19 = vfmadd213ps_fma(auVar57,auVar19,auVar61);
    fVar74 = auVar19._0_4_;
    auVar31._0_4_ = fVar74 * fVar74;
    fVar23 = auVar19._4_4_;
    auVar31._4_4_ = fVar23 * fVar23;
    fVar43 = auVar19._8_4_;
    auVar31._8_4_ = fVar43 * fVar43;
    fVar76 = auVar19._12_4_;
    auVar31._12_4_ = fVar76 * fVar76;
    auVar19 = vmovshdup_avx(auVar31);
    fVar62 = 1.0 - auVar31._0_4_;
    if (fVar62 < 0.0) {
      auVar39._0_4_ = sqrtf(fVar62);
      auVar39._4_60_ = extraout_var_05;
      auVar17 = auVar39._0_16_;
    }
    else {
      auVar17 = vsqrtss_avx(ZEXT416((uint)fVar62),ZEXT416((uint)fVar62));
    }
    fVar62 = auVar15._0_4_;
    auVar58._0_4_ = fVar62 * fVar74;
    auVar58._4_4_ = fVar62 * fVar23;
    auVar58._8_4_ = fVar62 * fVar43;
    auVar58._12_4_ = fVar62 * fVar76;
    fVar74 = 1.0 - auVar19._0_4_;
    if (fVar74 < 0.0) {
      auVar40._0_4_ = sqrtf(fVar74);
      auVar40._4_60_ = extraout_var_06;
      auVar19 = auVar40._0_16_;
    }
    else {
      auVar19 = vsqrtss_avx(ZEXT416((uint)fVar74),ZEXT416((uint)fVar74));
    }
    auVar64 = ZEXT416((uint)((fVar21 + (float)((uint)bVar5 * 0x40490fdb +
                                              (uint)!bVar5 *
                                              ((uint)bVar4 * (int)(auVar38._0_4_ + -6.2831855) +
                                              (uint)!bVar4 * (int)auVar38._0_4_)) + local_158) /
                            fVar77));
    auVar19 = vinsertps_avx(auVar17,auVar19,0x10);
    auVar48._4_4_ = local_108;
    auVar48._0_4_ = local_108;
    auVar48._8_4_ = local_108;
    auVar48._12_4_ = local_108;
    uVar3 = vcmpss_avx512f(auVar64,ZEXT816(0) << 0x40,1);
    auVar19 = vdivps_avx(auVar58,auVar19);
    auVar19 = vsubps_avx(auVar19,auVar48);
    auVar6._8_4_ = 0x7fffffff;
    auVar6._0_8_ = 0x7fffffff7fffffff;
    auVar6._12_4_ = 0x7fffffff;
    auVar15 = vandps_avx512vl(auVar19,auVar6);
    auVar19 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar64);
    iVar8 = (uint)!(bool)((byte)uVar3 & 1) * auVar19._0_4_;
    auVar20._4_12_ = auVar19._4_12_;
    auVar20._0_4_ = iVar8;
    auVar19 = vshufps_avx(auVar15,auVar15,0xf5);
    if (auVar19._0_4_ <= auVar15._0_4_) {
      auVar32._4_12_ = auVar28._4_12_;
      auVar32._0_4_ = iVar8;
      TVar24 = auVar32._0_8_;
    }
    else {
      auVar28 = vinsertps_avx(auVar20,ZEXT416((uint)auVar28._0_4_),0x1c);
      TVar24 = auVar28._0_8_;
    }
  }
  else {
    fVar21 = (ex->super_Tuple3<pbrt::Vector3,_float>).y;
    fVar74 = (ex->super_Tuple3<pbrt::Vector3,_float>).x;
    fVar23 = (ex->super_Tuple3<pbrt::Vector3,_float>).z;
    fVar76 = (pRect->super_Tuple3<pbrt::Point3,_float>).y - (s->super_Tuple3<pbrt::Point3,_float>).y
    ;
    auVar19 = ZEXT416((uint)((pRect->super_Tuple3<pbrt::Point3,_float>).x -
                            (s->super_Tuple3<pbrt::Point3,_float>).x));
    auVar28 = vfmadd231ss_fma(ZEXT416((uint)(fVar76 * fVar21)),auVar19,ZEXT416((uint)fVar74));
    auVar15 = ZEXT416((uint)((pRect->super_Tuple3<pbrt::Point3,_float>).z -
                            (s->super_Tuple3<pbrt::Point3,_float>).z));
    auVar28 = vfmadd231ss_fma(auVar28,auVar15,ZEXT416((uint)fVar23));
    fVar43 = (ey->super_Tuple3<pbrt::Vector3,_float>).x;
    auVar59._0_4_ = auVar28._0_4_ / (fVar74 * fVar74 + fVar21 * fVar21 + fVar23 * fVar23);
    auVar59._4_12_ = auVar28._4_12_;
    fVar21 = (ey->super_Tuple3<pbrt::Vector3,_float>).y;
    auVar28 = vfmadd231ss_fma(ZEXT416((uint)(fVar76 * fVar21)),ZEXT416((uint)fVar43),auVar19);
    fVar74 = (ey->super_Tuple3<pbrt::Vector3,_float>).z;
    auVar28 = vfmadd231ss_fma(auVar28,ZEXT416((uint)fVar74),auVar15);
    auVar30._0_4_ = auVar28._0_4_ / (fVar43 * fVar43 + fVar21 * fVar21 + fVar74 * fVar74);
    auVar30._4_12_ = auVar28._4_12_;
    auVar28 = vinsertps_avx(auVar59,auVar30,0x10);
    TVar24 = auVar28._0_8_;
  }
  return (Point2f)TVar24;
}

Assistant:

Point2f InvertSphericalRectangleSample(const Point3f &pRef, const Point3f &s,
                                       const Vector3f &ex, const Vector3f &ey,
                                       const Point3f &pRect) {
    // TODO: Delete anything unused in the below...

    // SphQuadInit()
    // local reference system 'R'
    Float exl = Length(ex), eyl = Length(ey);
    Frame R = Frame::FromXY(ex / exl, ey / eyl);

    // compute rectangle coords in local reference system
    Vector3f d = s - pRef;
    Vector3f dLocal = R.ToLocal(d);
    Float z0 = dLocal.z;

    // flip 'z' to make it point against 'Q'
    if (z0 > 0) {
        R.z = -R.z;
        z0 *= -1;
    }
    Float z0sq = Sqr(z0);
    Float x0 = dLocal.x;
    Float y0 = dLocal.y;
    Float x1 = x0 + exl;
    Float y1 = y0 + eyl;
    Float y0sq = Sqr(y0), y1sq = Sqr(y1);

    // create vectors to four vertices
    Vector3f v00(x0, y0, z0), v01(x0, y1, z0);
    Vector3f v10(x1, y0, z0), v11(x1, y1, z0);

    // compute normals to edges
    Vector3f n0 = Normalize(Cross(v00, v10));
    Vector3f n1 = Normalize(Cross(v10, v11));
    Vector3f n2 = Normalize(Cross(v11, v01));
    Vector3f n3 = Normalize(Cross(v01, v00));

    // compute internal angles (gamma_i)
    Float g0 = AngleBetween(-n0, n1);
    Float g1 = AngleBetween(-n1, n2);
    Float g2 = AngleBetween(-n2, n3);
    Float g3 = AngleBetween(-n3, n0);

    // compute predefined constants
    Float b0 = n0.z, b1 = n2.z, b0sq = Sqr(b0), b1sq = Sqr(b1);

    // compute solid angle from internal angles
    Float solidAngle = double(g0) + double(g1) + double(g2) + double(g3) - 2. * Pi;

    // TODO: this (rarely) goes differently than sample. figure out why...
    if (solidAngle < 1e-3) {
        Vector3f pq = pRect - s;
        return Point2f(Dot(pq, ex) / LengthSquared(ex), Dot(pq, ey) / LengthSquared(ey));
    }

    Vector3f v = R.ToLocal(pRect - pRef);
    Float xu = v.x, yv = v.y;

    xu = Clamp(xu, x0, x1);  // avoid Infs
    if (xu == 0)
        xu = 1e-10;

    // DOing all this in double actually makes things slightly worse???!?
    // Float fusq = (1 - b0sq * Sqr(cu)) / Sqr(cu);
    // Float fusq = 1 / Sqr(cu) - b0sq;  // more stable
    Float invcusq = 1 + z0sq / Sqr(xu);
    Float fusq = invcusq - b0sq;  // the winner so far
    Float fu = std::copysign(std::sqrt(fusq), xu);
    // Note, though have 1 + z^2/x^2 - b0^2, which isn't great if b0 \approx 1
    // double fusq = 1. - Sqr(double(b0)) + Sqr(double(z0) / double(xu));  //
    // this is worse?? double fu = std::copysign(std::sqrt(fusq), cu);
    CHECK_RARE(1e-6, fu == 0);

    // State of the floating point world: in the bad cases, about half the
    // error seems to come from inaccuracy in fu and half comes from
    // inaccuracy in sqrt/au.
    //
    // For fu, the main issue comes adding a small value to 1+ in invcusq
    // and then having b0sq be close to one, so having catastrophic
    // cancellation affect fusq. Approximating it as z0sq / Sqr(xu) when
    // b0sq is close to one doesn't help, however..
    //
    // For au, DifferenceOfProducts doesn't seem to help with the two
    // factors. Furthermore, while it would be nice to think about this
    // like atan(y/x) and then rewrite/simplify y/x, we need to do so in a
    // way that doesn't flip the sign of x and y, which would be fine if we
    // were computing y/x, but messes up atan2's quadrant-determinations...

    Float sqrt = SafeSqrt(DifferenceOfProducts(b0, b0, b1, b1) + fusq);
    // No benefit to difference of products here...
    Float au = std::atan2(-(b1 * fu) - std::copysign(b0 * sqrt, fu * b0),
                          b0 * b1 - sqrt * std::abs(fu));
    if (au > 0)
        au -= 2 * Pi;

    if (fu == 0)
        au = Pi;
    Float u0 = (au + g2 + g3) / solidAngle;

    Float ddsq = Sqr(xu) + z0sq;
    Float dd = std::sqrt(ddsq);
    Float h0 = y0 / std::sqrt(ddsq + y0sq);
    Float h1 = y1 / std::sqrt(ddsq + y1sq);
    Float yvsq = Sqr(yv);

    Float u1[2] = {(DifferenceOfProducts(h0, h0, h0, h1) -
                    std::abs(h0 - h1) * std::sqrt(yvsq * (ddsq + yvsq)) / (ddsq + yvsq)) /
                       Sqr(h0 - h1),
                   (DifferenceOfProducts(h0, h0, h0, h1) +
                    std::abs(h0 - h1) * std::sqrt(yvsq * (ddsq + yvsq)) / (ddsq + yvsq)) /
                       Sqr(h0 - h1)};

    // TODO: yuck is there a better way to figure out which is the right
    // solution?
    Float hv[2] = {Lerp(u1[0], h0, h1), Lerp(u1[1], h0, h1)};
    Float hvsq[2] = {Sqr(hv[0]), Sqr(hv[1])};
    Float yz[2] = {(hv[0] * dd) / std::sqrt(1 - hvsq[0]),
                   (hv[1] * dd) / std::sqrt(1 - hvsq[1])};

    Point2f u = (std::abs(yz[0] - yv) < std::abs(yz[1] - yv))
                    ? Point2f(Clamp(u0, 0, 1), u1[0])
                    : Point2f(Clamp(u0, 0, 1), u1[1]);

    return u;
}